

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hh
# Opt level: O3

void __thiscall
tchecker::graph::
lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>::clear
          (lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
           *this)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  local_18;
  
  local_18._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  ::operator=(&this->_first,&local_18);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_18);
  local_18._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  ::operator=(&this->_loop_root,&local_18);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_18);
  this->_has_loop = false;
  reachability::
  multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>::clear
            (&this->
              super_multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
            );
  return;
}

Assistant:

void clear()
  {
    _first = nullptr;
    _loop_root = nullptr;
    _has_loop = false;
    tchecker::graph::reachability::multigraph_t<NODE, EDGE>::clear();
  }